

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# networkDataTypes.cpp
# Opt level: O3

bool __thiscall NDevice::isValid(NDevice *this)

{
  pointer pNVar1;
  pointer pNVar2;
  bool bVar3;
  int *piVar4;
  ulong uVar5;
  ulong uVar6;
  ulong uVar7;
  char *__return_storage_ptr__;
  vector<NDeviceChannel,_std::allocator<NDeviceChannel>_> *in_R9;
  
  bVar3 = false;
  if ((((this->name)._M_string_length != 0) && (bVar3 = false, this->numBytes != -1)) &&
     (this->byteOffset != -1)) {
    pNVar1 = (this->channels).super__Vector_base<NDeviceChannel,_std::allocator<NDeviceChannel>_>.
             _M_impl.super__Vector_impl_data._M_start;
    pNVar2 = (this->channels).super__Vector_base<NDeviceChannel,_std::allocator<NDeviceChannel>_>.
             _M_impl.super__Vector_impl_data._M_finish;
    if (pNVar1 == pNVar2) {
      bVar3 = false;
    }
    else {
      uVar5 = (long)pNVar2 - (long)pNVar1 >> 6;
      if ((int)(uint)uVar5 < 1) {
        bVar3 = true;
      }
      else {
        uVar6 = (ulong)((uint)uVar5 & 0x7fffffff);
        piVar4 = &pNVar1->type;
        uVar7 = 0;
        do {
          if (uVar5 == uVar7) {
            __return_storage_ptr__ =
                 "vector::_M_range_check: __n (which is %zu) >= this->size() (which is %zu)";
            std::__throw_out_of_range_fmt
                      ("vector::_M_range_check: __n (which is %zu) >= this->size() (which is %zu)");
            NetworkDataType::
            serializedata<std::__cxx11::string_const,int_const,int_const,std::vector<NDeviceChannel,std::allocator<NDeviceChannel>>const>
                      ((binarydata *)__return_storage_ptr__,(NetworkDataType *)(uVar5 + 8),
                       (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                       (uVar5 + 0x28),(int *)(uVar5 + 0x2c),(int *)(uVar5 + 0x30),in_R9);
            return SUB81(__return_storage_ptr__,0);
          }
          if (*(size_type *)(piVar4 + -8) == 0) {
            return false;
          }
          if (piVar4[-2] == -1) {
            return false;
          }
          if (*piVar4 == -1) {
            return false;
          }
          if (piVar4[-1] == -1) {
            return false;
          }
          uVar7 = uVar7 + 1;
          piVar4 = piVar4 + 0x10;
        } while (uVar6 != uVar7);
        bVar3 = uVar6 <= uVar7;
      }
    }
  }
  return bVar3;
}

Assistant:

bool NDevice::isValid() const {
    if (name.empty() || numBytes == -1 || byteOffset == -1 || channels.empty())
        return(false); // a device must have a name, a set numBytes, a set byteOffset, and at least one channel
    for (int i = 0; i < (int)channels.size(); i++) {
        if (!channels.at(i).isValid()) //make sure all channels are valid
            return(false);
    }
    return(true);
}